

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfbscreen_p.cpp
# Opt level: O1

void * __thiscall QFbScreen::qt_metacast(QFbScreen *this,char *_clname)

{
  int iVar1;
  void *pvVar2;
  
  if (_clname == (char *)0x0) {
    this = (QFbScreen *)0x0;
  }
  else {
    iVar1 = strcmp(_clname,qt_staticMetaObjectStaticContent<(anonymous_namespace)::qt_meta_tag_ZN9QFbScreenE_t>
                           .strings);
    if (iVar1 != 0) {
      iVar1 = strcmp(_clname,"QPlatformScreen");
      if (iVar1 != 0) {
        pvVar2 = (void *)QObject::qt_metacast((char *)this);
        return pvVar2;
      }
      this = this + 0x10;
    }
  }
  return this;
}

Assistant:

void *QFbScreen::qt_metacast(const char *_clname)
{
    if (!_clname) return nullptr;
    if (!strcmp(_clname, qt_staticMetaObjectStaticContent<qt_meta_tag_ZN9QFbScreenE_t>.strings))
        return static_cast<void*>(this);
    if (!strcmp(_clname, "QPlatformScreen"))
        return static_cast< QPlatformScreen*>(this);
    return QObject::qt_metacast(_clname);
}